

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRandomUniformDynamicLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  float *pfVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  LayerUnion LVar4;
  long *plVar5;
  size_type *psVar6;
  string err;
  Result r;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  undefined1 local_88 [24];
  size_type *local_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Result::Result((Result *)&local_70);
  validateInputCount((Result *)local_98,layer,1,1);
  local_70 = (size_type *)local_98;
  std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
  if (local_90._M_p != local_88 + 8) {
    operator_delete(local_90._M_p,local_88._8_8_ + 1);
  }
  bVar3 = Result::good((Result *)&local_70);
  if (bVar3) {
    validateOutputCount((Result *)local_98,layer,1,1);
    local_70 = (size_type *)local_98;
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
    if (local_90._M_p != local_88 + 8) {
      operator_delete(local_90._M_p,local_88._8_8_ + 1);
    }
  }
  if (layer->_oneof_case_[0] == 0x4b0) {
    LVar4 = layer->layer_;
  }
  else {
    LVar4.randomuniformdynamic_ = Specification::RandomUniformDynamicLayerParams::default_instance()
    ;
  }
  pfVar1 = (float *)((long)&((LVar4.convolution_)->kernelsize_).rep_ + 4);
  if ((LVar4.unary_)->epsilon_ < *pfVar1 || (LVar4.unary_)->epsilon_ == *pfVar1) {
    *(size_type **)__return_storage_ptr__ = local_70;
    paVar2 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p == &local_58) {
      paVar2->_M_allocated_capacity =
           CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_58._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_68._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_60;
    local_60 = 0;
    local_58._M_local_buf[0] = '\0';
    local_68._M_p = (pointer)&local_58;
  }
  else {
    std::operator+(&local_48,"Value of minval should be smaller than maxval for \'",
                   (layer->name_).ptr_);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      local_88._0_8_ = *psVar6;
      local_88._8_8_ = plVar5[3];
      local_98 = (undefined1  [8])local_88;
    }
    else {
      local_88._0_8_ = *psVar6;
      local_98 = (undefined1  [8])*plVar5;
    }
    local_90._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
    if (local_98 != (undefined1  [8])local_88) {
      operator_delete((void *)local_98,local_88._0_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,
                    CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRandomUniformDynamicLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.randomuniformdynamic();
    if (params.minval() > params.maxval()) {
        const std::string err = "Value of minval should be smaller than maxval for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}